

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall util_tests::util_WriteBinaryFile::test_method(util_WriteBinaryFile *this)

{
  long lVar1;
  readonly_property65 rVar2;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  undefined1 local_3e0 [16];
  undefined1 *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  string *local_370;
  undefined **local_368;
  element_type *local_360;
  shared_count sStack_358;
  string **local_350;
  string *local_348;
  lazy_ostream local_340;
  undefined1 *local_330;
  string **local_328;
  char *local_320;
  char *local_318;
  assertion_result local_310;
  ifstream file;
  string actual_text;
  string expected_text;
  path local_b0;
  path tmpfile;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false)
  ;
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::_M_append(&local_b0,0x10,"write_binary.dat");
  std::filesystem::__cxx11::path::path(&tmpfile.super_path,&local_b0);
  std::filesystem::__cxx11::path::~path(&local_b0);
  expected_text._M_dataplus._M_p = (pointer)&expected_text.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&expected_text,"bitcoin","");
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)WriteBinaryFile(&tmpfile,&expected_text);
  actual_text._M_dataplus._M_p = (pointer)&actual_text.field_2;
  actual_text._M_string_length = 0;
  actual_text.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,tmpfile.super_path._M_pathname._M_dataplus._M_p,_S_in);
  std::operator>>((istream *)&file,(string *)&actual_text);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x75b5a8;
  file_00.m_end = (iterator)0x70f;
  file_00.m_begin = (iterator)&local_380;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_390,msg);
  local_368 = (undefined **)
              CONCAT71(local_368._1_7_,
                       rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_360 = (element_type *)0x0;
  sStack_358.pi_ = (sp_counted_base *)0x0;
  local_328 = (string **)local_3e0;
  local_3e0._0_8_ = "valid";
  local_3e0._8_8_ = "";
  local_340.m_empty = false;
  local_340._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_398 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_368,&local_340,1,0,WARN,_cVar6,(size_t)&local_3a0,0x70f);
  boost::detail::shared_count::~shared_count(&sStack_358);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x710;
  file_01.m_begin = (iterator)&local_3b0;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c0,
             msg_00);
  local_3e0._8_8_ = local_3e0._8_8_ & 0xffffffffffffff00;
  local_3e0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_3d0 = boost::unit_test::lazy_ostream::inst;
  local_3c8 = "";
  if (actual_text._M_string_length == expected_text._M_string_length) {
    if (actual_text._M_string_length == 0) {
      local_310.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar3 = bcmp(actual_text._M_dataplus._M_p,expected_text._M_dataplus._M_p,
                   actual_text._M_string_length);
      local_310.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar3 == 0);
    }
  }
  else {
    local_310.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_348 = &actual_text;
  local_310.m_message.px = (element_type *)0x0;
  local_310.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_318 = "";
  local_328 = &local_348;
  local_340.m_empty = false;
  local_340._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbf0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = &expected_text;
  local_360 = (element_type *)((ulong)local_360 & 0xffffffffffffff00);
  local_368 = &PTR__lazy_ostream_013abbf0;
  sStack_358.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_310,(lazy_ostream *)local_3e0,1,2,REQUIRE,0xf7464e,(size_t)&local_320,0x710,
             &local_340,"expected_text",(assertion_result *)&local_368);
  boost::detail::shared_count::~shared_count(&local_310.m_message.pn);
  std::ifstream::~ifstream(&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)actual_text._M_dataplus._M_p != &actual_text.field_2) {
    operator_delete(actual_text._M_dataplus._M_p,
                    CONCAT71(actual_text.field_2._M_allocated_capacity._1_7_,
                             actual_text.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected_text._M_dataplus._M_p != &expected_text.field_2) {
    operator_delete(expected_text._M_dataplus._M_p,expected_text.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&tmpfile.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_WriteBinaryFile)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    fs::path tmpfile = tmpfolder / "write_binary.dat";
    std::string expected_text = "bitcoin";
    auto valid = WriteBinaryFile(tmpfile, expected_text);
    std::string actual_text;
    std::ifstream file{tmpfile};
    file >> actual_text;
    BOOST_CHECK(valid);
    BOOST_CHECK_EQUAL(actual_text, expected_text);
}